

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  lua_State *L;
  Table *t;
  TValue *i_o_1;
  Value VVar1;
  TValue *pTVar2;
  TValue *i_o;
  Value local_28;
  undefined4 local_20;
  
  L = ls->L;
  VVar1.gc = (GCObject *)luaS_newlstr(L,str,l);
  t = ls->fs->h;
  pTVar2 = &t->node[(int)(~(uint)(-1L << (t->lsizenode & 0x3f)) & *(uint *)((long)VVar1.gc + 0xc))].
            i_val;
  do {
    if (((((Node *)pTVar2)->i_key).nk.tt == 4) &&
       ((((Node *)pTVar2)->i_key).nk.value.gc == VVar1.gc)) goto LAB_0010c7ac;
    pTVar2 = &((((Node *)pTVar2)->i_key).nk.next)->i_val;
  } while ((Node *)pTVar2 != (Node *)0x0);
  pTVar2 = &luaO_nilobject_;
LAB_0010c7ac:
  if (pTVar2 == &luaO_nilobject_) {
    local_20 = 4;
    local_28.gc = VVar1.gc;
    pTVar2 = newkey(L,t,(TValue *)&local_28);
  }
  if ((((Node *)pTVar2)->i_val).tt == 0) {
    (((Node *)pTVar2)->i_val).value.b = 1;
    (((Node *)pTVar2)->i_val).tt = 1;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
  }
  return (TString *)(GCObject *)VVar1;
}

Assistant:

static TString*luaX_newstring(LexState*ls,const char*str,size_t l){
lua_State*L=ls->L;
TString*ts=luaS_newlstr(L,str,l);
TValue*o=luaH_setstr(L,ls->fs->h,ts);
if(ttisnil(o)){
setbvalue(o,1);
luaC_checkGC(L);
}
return ts;
}